

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O0

int zueci_gb2312_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  byte bVar2;
  zueci_u32 u2;
  int ind;
  uchar c2;
  uchar c1;
  zueci_u32 *p_u_local;
  uint flags_local;
  zueci_u32 len_local;
  uchar *src_local;
  int local_4;
  
  bVar1 = *src;
  if (bVar1 < 0x80) {
    *p_u = (uint)bVar1;
    local_4 = 1;
  }
  else if ((((len < 2) || (bVar1 < 0xa1)) || ((0xa9 < bVar1 && (bVar1 < 0xb0)))) || (0xf7 < bVar1))
  {
    local_4 = 0;
  }
  else {
    bVar2 = src[1];
    if ((bVar2 < 0xa1) || (bVar2 == 0xff)) {
      local_4 = 0;
    }
    else if (zueci_gb2312_mb_u
             [(int)(((bVar1 - 0xa1) + (uint)(0xa9 < bVar1) * -6) * 0x5e + (uint)bVar2 + -0xa1)] == 0
            ) {
      local_4 = 0;
    }
    else {
      *p_u = (uint)zueci_gb2312_mb_u
                   [(int)(((bVar1 - 0xa1) + (uint)(0xa9 < bVar1) * -6) * 0x5e + (uint)bVar2 + -0xa1)
                   ];
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

static int zueci_gb2312_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    unsigned char c1, c2;
    int ind;
    zueci_u32 u2;

    (void)flags;
    assert(len);

    c1 = src[0];
    if (c1 < 0x80) {
        *p_u = c1;
        return 1;
    }
    if (len < 2 || c1 < 0xA1 || (c1 > 0xA9 && c1 < 0xB0) || c1 > 0xF7) {
        return 0;
    }
    c2 = src[1];
    if (c2 < 0xA1 || c2 == 0xFF) {
        return 0;
    }
    ind = (0xFF - 0xA1) * (c1 - 0xA1 - (c1 > 0xA9) * (0xB0 - 0xAA)) + c2 - 0xA1;
    assert(ind < ZUECI_ASIZE(zueci_gb2312_mb_u));
    if ((u2 = zueci_gb2312_mb_u[ind])) {
        *p_u = u2;
        return 2;
    }
    return 0;
}